

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QPointF *p)

{
  storage_type *in_RCX;
  double *in_RDX;
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)p);
  pQVar1 = (QTextStream *)p->xp;
  *(undefined1 *)&pQVar1[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QPointF";
  QString::fromUtf8(&local_40,(QString *)&DAT_00000007,ba);
  QTextStream::operator<<(pQVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  QTextStream::operator<<(pQVar1,'(');
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  QTextStream::operator<<(pQVar1,*in_RDX);
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  QTextStream::operator<<(pQVar1,',');
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  QTextStream::operator<<(pQVar1,in_RDX[1]);
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  QTextStream::operator<<(pQVar1,')');
  pQVar1 = (QTextStream *)p->xp;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = (QTextStream *)p->xp;
  }
  p->xp = 0.0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPointF &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QPointF" << '(';
    QtDebugUtils::formatQPoint(dbg, p);
    dbg << ')';
    return dbg;
}